

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollfd.c
# Opt level: O3

int lws_callback_on_writable_all_protocol(lws_context *context,lws_protocols *protocol)

{
  int iVar1;
  lws_vhost *vhost;
  lws_callback_function *plVar2;
  int iVar3;
  lws_callback_function **pplVar4;
  ulong uVar5;
  
  if (context != (lws_context *)0x0) {
    for (vhost = context->vhost_list; vhost != (lws_vhost *)0x0; vhost = vhost->vhost_next) {
      iVar1 = vhost->count_protocols;
      uVar5 = 0;
      if ((long)iVar1 < 1) {
LAB_001266d8:
        if ((int)uVar5 != iVar1) {
          lws_callback_on_writable_all_protocol_vhost(vhost,vhost->protocols + (uVar5 & 0xffffffff))
          ;
        }
      }
      else {
        plVar2 = protocol->callback;
        pplVar4 = &vhost->protocols->callback;
        uVar5 = 0;
        do {
          if ((plVar2 == *pplVar4) &&
             (iVar3 = strcmp(protocol->name,((lws_protocols *)(pplVar4 + -1))->name), iVar3 == 0))
          goto LAB_001266d8;
          uVar5 = uVar5 + 1;
          pplVar4 = pplVar4 + 7;
        } while ((long)iVar1 != uVar5);
      }
    }
  }
  return 0;
}

Assistant:

int
lws_callback_on_writable_all_protocol(const struct lws_context *context,
				      const struct lws_protocols *protocol)
{
	struct lws_vhost *vhost;
	int n;

	if (!context)
		return 0;

	vhost = context->vhost_list;

	while (vhost) {
		for (n = 0; n < vhost->count_protocols; n++)
			if (protocol->callback ==
			     vhost->protocols[n].callback &&
			    !strcmp(protocol->name, vhost->protocols[n].name))
				break;
		if (n != vhost->count_protocols)
			lws_callback_on_writable_all_protocol_vhost(
				vhost, &vhost->protocols[n]);

		vhost = vhost->vhost_next;
	}

	return 0;
}